

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void plain_array_suite::remove_back_n(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  basic_iterator<int> first_end_05;
  basic_iterator<int> first_end_06;
  reference piVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> input_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> input_01;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> input_02;
  initializer_list<int> __l_05;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  basic_iterator<int> first_begin_05;
  basic_iterator<int> first_begin_06;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_f9;
  vector<int,_std::allocator<int>_> local_f8;
  circular_view<int,_18446744073709551615UL> local_d8;
  int local_b8 [4];
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  type local_28 [6];
  
  local_d8.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_d8.member.cap = 4;
  local_d8.member.size = 0;
  local_d8.member.next = 4;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,1);
  local_b8[0] = 0xb;
  local_b8[1] = 0x16;
  local_b8[2] = 0x21;
  __l._M_len = 3;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_30 = local_d8.member.next % uVar1;
  }
  first_end.current = sStack_30;
  first_end.parent = &local_d8;
  first_begin.current = uVar3;
  first_begin.parent = &local_d8;
  local_38 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6f4,"void plain_array_suite::remove_back_n()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_d8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_d8);
  *piVar2 = 0x37;
  local_b8[0] = 0x37;
  local_b8[1] = 0xb;
  local_b8[2] = 0x16;
  local_b8[3] = 0x21;
  __l_00._M_len = 4;
  __l_00._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_00,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_40 = local_d8.member.next % uVar1;
  }
  first_end_00.current = sStack_40;
  first_end_00.parent = &local_d8;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_d8;
  local_48 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6fa,"void plain_array_suite::remove_back_n()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input_00._M_len = 4;
  input_00._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,2);
  local_b8[0] = 0xb;
  local_b8[1] = 0x16;
  __l_01._M_len = 2;
  __l_01._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_01,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_50 = local_d8.member.next % uVar1;
  }
  first_end_01.current = sStack_50;
  first_end_01.parent = &local_d8;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_d8;
  local_58 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x702,"void plain_array_suite::remove_back_n()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_d8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_d8);
  *piVar2 = 0x37;
  local_b8[0] = 0x37;
  local_b8[1] = 0xb;
  local_b8[2] = 0x16;
  __l_02._M_len = 3;
  __l_02._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_02,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_60 = local_d8.member.next % uVar1;
  }
  first_end_02.current = sStack_60;
  first_end_02.parent = &local_d8;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_d8;
  local_68 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x708,"void plain_array_suite::remove_back_n()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input_01._M_len = 4;
  input_01._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,3);
  local_b8[0] = 0xb;
  __l_03._M_len = 1;
  __l_03._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_03,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_70 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_70 = local_d8.member.next % uVar1;
  }
  first_end_03.current = sStack_70;
  first_end_03.parent = &local_d8;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_d8;
  local_78 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x710,"void plain_array_suite::remove_back_n()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_d8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_d8);
  *piVar2 = 0x37;
  local_b8[0] = 0x37;
  local_b8[1] = 0xb;
  __l_04._M_len = 2;
  __l_04._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_04,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_80 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_80 = local_d8.member.next % uVar1;
  }
  first_end_04.current = sStack_80;
  first_end_04.parent = &local_d8;
  first_begin_04.current = uVar3;
  first_begin_04.parent = &local_d8;
  local_88 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x716,"void plain_array_suite::remove_back_n()",first_begin_04,first_end_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input_02._M_len = 4;
  input_02._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_d8,input_02);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,4);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_90 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_90 = local_d8.member.next % uVar1;
  }
  first_end_05.current = sStack_90;
  first_end_05.parent = &local_d8;
  first_begin_05.current = uVar3;
  first_begin_05.parent = &local_d8;
  local_98 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x71e,"void plain_array_suite::remove_back_n()",first_begin_05,first_end_05,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_d8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::front(&local_d8);
  *piVar2 = 0x37;
  local_b8[0] = 0x37;
  __l_05._M_len = 1;
  __l_05._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_05,&local_f9);
  uVar1 = local_d8.member.cap * 2;
  if ((uVar1 & local_d8.member.cap * 2 - 1) == 0) {
    uVar3 = local_d8.member.next - local_d8.member.size & uVar1 - 1;
    sStack_a0 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    uVar3 = (local_d8.member.next - local_d8.member.size) % uVar1;
    sStack_a0 = local_d8.member.next % uVar1;
  }
  first_end_06.current = sStack_a0;
  first_end_06.parent = &local_d8;
  first_begin_06.current = uVar3;
  first_begin_06.parent = &local_d8;
  local_a8 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x724,"void plain_array_suite::remove_back_n()",first_begin_06,first_end_06,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void remove_back_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    span.remove_back(1);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }

    span = { 11, 22, 33, 44 };
    span.remove_back(2);
    {
        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }

    span = { 11, 22, 33, 44 };
    span.remove_back(3);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }

    span = { 11, 22, 33, 44 };
    span.remove_back(4);
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}